

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  reference pvVar1;
  int in_EDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double dVar2;
  Expression EVar3;
  Expression ph_t;
  Expression i_ot;
  Expression i_aot;
  Expression i_crt;
  Expression i_nwt;
  Expression i_wt;
  Expression i_awt;
  Expression i_ft;
  Expression i_it;
  Expression i_ait;
  bool has_prev_state;
  Expression i_c_tm1;
  Expression i_h_tm1;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *vars;
  uint i;
  Expression in;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *ct;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *ht;
  initializer_list<dynet::expr::Expression> *in_stack_fffffffffffffb48;
  Expression *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb60;
  size_type in_stack_fffffffffffffb68;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
  *in_stack_fffffffffffffb70;
  Expression *in_stack_fffffffffffffb80;
  Expression *in_stack_fffffffffffffb88;
  byte local_461;
  expr local_408 [32];
  undefined1 local_3e8 [16];
  initializer_list<dynet::expr::Expression> aiStack_3d8 [2];
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_388 [16];
  Expression aEStack_378 [4];
  undefined1 *local_338;
  undefined8 local_330;
  expr local_2b8 [16];
  undefined1 local_2a8 [48];
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_258 [80];
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1b8 [16];
  Expression aEStack_1a8 [2];
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_158 [16];
  Expression aEStack_148 [4];
  undefined1 *local_108;
  undefined8 local_100;
  byte local_c1;
  reference local_a0;
  uint local_94;
  reference local_80;
  reference local_78;
  int local_14;
  
  local_14 = in_EDX;
  std::allocator<dynet::expr::Expression>::allocator((allocator<dynet::expr::Expression> *)0x9ab405)
  ;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffb60);
  std::allocator<dynet::expr::Expression>::~allocator
            ((allocator<dynet::expr::Expression> *)0x9ab455);
  std::allocator<dynet::expr::Expression>::allocator((allocator<dynet::expr::Expression> *)0x9ab486)
  ;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffb60);
  std::allocator<dynet::expr::Expression>::~allocator
            ((allocator<dynet::expr::Expression> *)0x9ab4cd);
  local_78 = std::
             vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             ::back((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffb50);
  local_80 = std::
             vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             ::back((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffb50);
  dynet::expr::Expression::Expression
            (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
  for (local_94 = 0; local_94 < *(uint *)(in_RSI + 200); local_94 = local_94 + 1) {
    local_a0 = std::
               vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
                             *)(in_RSI + 0x48),(ulong)local_94);
    dynet::expr::Expression::Expression((Expression *)0x9ab569);
    dynet::expr::Expression::Expression((Expression *)0x9ab576);
    local_461 = 1;
    if (local_14 < 0) {
      local_461 = *(byte *)(in_RSI + 0x90);
    }
    local_c1 = local_461 & 1;
    if (local_14 < 0) {
      if ((*(byte *)(in_RSI + 0x90) & 1) != 0) {
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                  ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                   (in_RSI + 0x98),(ulong)local_94);
        dynet::expr::Expression::operator=
                  (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                  ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                   (in_RSI + 0xb0),(ulong)local_94);
        dynet::expr::Expression::operator=
                  (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      }
    }
    else {
      pvVar1 = std::
               vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
                             *)(in_RSI + 0x60),(long)local_14);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_94);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      pvVar1 = std::
               vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
                             *)(in_RSI + 0x78),(long)local_14);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_94);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    dynet::expr::Expression::Expression((Expression *)0x9ab73c);
    if ((local_c1 & 1) == 0) {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,3);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb80 = aEStack_1a8;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,0);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_188 = local_1b8;
      local_180 = 3;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    else {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,3);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb88 = aEStack_148;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,0);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,1);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_108 = local_158;
      local_100 = 5;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,2);
      dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    dynet::expr::logistic(in_stack_fffffffffffffb88);
    dVar2 = SUB648(ZEXT464(0x3f800000),0);
    dynet::expr::operator-
              ((real)((ulong)in_stack_fffffffffffffb88 >> 0x20),in_stack_fffffffffffffb80);
    dynet::expr::Expression::Expression((Expression *)0x9ab97e);
    if ((local_c1 & 1) == 0) {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,10);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,8);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_278 = local_2a8;
      local_270 = 3;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    else {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,10);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,8);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,9);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_208 = local_258;
      local_200 = 5;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    dVar2 = dynet::expr::tanh(local_2b8,dVar2);
    if ((local_c1 & 1) == 0) {
      dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    else {
      dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    dynet::expr::Expression::Expression((Expression *)0x9abc2a);
    if ((local_c1 & 1) == 0) {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,7);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb48 = aiStack_3d8;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,4);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_3b8 = local_3e8;
      local_3b0 = 3;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    else {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,7);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb50 = aEStack_378;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,4);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,5);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      dynet::expr::Expression::Expression
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
      local_338 = local_388;
      local_330 = 5;
      dynet::expr::affine_transform(in_stack_fffffffffffffb48);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_a0,6);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      dynet::expr::Expression::operator=
                (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    }
    dynet::expr::logistic(in_stack_fffffffffffffb88);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
              (local_80,(ulong)local_94);
    dynet::expr::tanh(local_408,dVar2);
    dynet::expr::cmult(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::operator[]
              (local_78,(ulong)local_94);
    dynet::expr::Expression::operator=
              (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
    dynet::expr::Expression::operator=
              (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
  }
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::back
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffb50);
  dynet::expr::Expression::Expression
            (in_stack_fffffffffffffb50,(Expression *)in_stack_fffffffffffffb48);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = in_RDI;
  return EVar3;
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}